

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cpp
# Opt level: O0

void anon_unknown.dwarf_12b475::Distortion_setParamf(EffectProps *props,ALenum param,float val)

{
  effect_exception *peVar1;
  uint in_ESI;
  float *in_RDI;
  float in_XMM0_Da;
  
  switch(in_ESI) {
  case 1:
    if ((in_XMM0_Da < 0.0) || (1.0 < in_XMM0_Da)) {
      peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception(peVar1,0xa003,"Distortion edge out of range");
      __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    *in_RDI = in_XMM0_Da;
    break;
  case 2:
    if ((in_XMM0_Da < 0.01) || (1.0 < in_XMM0_Da)) {
      peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception(peVar1,0xa003,"Distortion gain out of range");
      __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    in_RDI[1] = in_XMM0_Da;
    break;
  case 3:
    if ((in_XMM0_Da < 80.0) || (24000.0 < in_XMM0_Da)) {
      peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception(peVar1,0xa003,"Distortion low-pass cutoff out of range");
      __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    in_RDI[2] = in_XMM0_Da;
    break;
  case 4:
    if ((in_XMM0_Da < 80.0) || (24000.0 < in_XMM0_Da)) {
      peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception(peVar1,0xa003,"Distortion EQ center out of range");
      __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    in_RDI[3] = in_XMM0_Da;
    break;
  case 5:
    if ((in_XMM0_Da < 80.0) || (24000.0 < in_XMM0_Da)) {
      peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception(peVar1,0xa003,"Distortion EQ bandwidth out of range");
      __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    in_RDI[4] = in_XMM0_Da;
    break;
  default:
    peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception
              (peVar1,0xa002,"Invalid distortion float property 0x%04x",(ulong)in_ESI);
    __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
  }
  return;
}

Assistant:

void Distortion_setParamf(EffectProps *props, ALenum param, float val)
{
    switch(param)
    {
    case AL_DISTORTION_EDGE:
        if(!(val >= AL_DISTORTION_MIN_EDGE && val <= AL_DISTORTION_MAX_EDGE))
            throw effect_exception{AL_INVALID_VALUE, "Distortion edge out of range"};
        props->Distortion.Edge = val;
        break;

    case AL_DISTORTION_GAIN:
        if(!(val >= AL_DISTORTION_MIN_GAIN && val <= AL_DISTORTION_MAX_GAIN))
            throw effect_exception{AL_INVALID_VALUE, "Distortion gain out of range"};
        props->Distortion.Gain = val;
        break;

    case AL_DISTORTION_LOWPASS_CUTOFF:
        if(!(val >= AL_DISTORTION_MIN_LOWPASS_CUTOFF && val <= AL_DISTORTION_MAX_LOWPASS_CUTOFF))
            throw effect_exception{AL_INVALID_VALUE, "Distortion low-pass cutoff out of range"};
        props->Distortion.LowpassCutoff = val;
        break;

    case AL_DISTORTION_EQCENTER:
        if(!(val >= AL_DISTORTION_MIN_EQCENTER && val <= AL_DISTORTION_MAX_EQCENTER))
            throw effect_exception{AL_INVALID_VALUE, "Distortion EQ center out of range"};
        props->Distortion.EQCenter = val;
        break;

    case AL_DISTORTION_EQBANDWIDTH:
        if(!(val >= AL_DISTORTION_MIN_EQBANDWIDTH && val <= AL_DISTORTION_MAX_EQBANDWIDTH))
            throw effect_exception{AL_INVALID_VALUE, "Distortion EQ bandwidth out of range"};
        props->Distortion.EQBandwidth = val;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM, "Invalid distortion float property 0x%04x", param};
    }
}